

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

void MD5Transform(UINT4 *state,uchar *block)

{
  UINT4 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint i;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int local_a8 [30];
  
  UVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    local_a8[lVar6] = *(int *)(block + lVar6 * 4);
  }
  uVar5 = ((uVar3 ^ uVar4) & uVar2 ^ uVar4) + UVar1 + local_a8[0] + 0xd76aa478;
  uVar5 = (uVar5 * 0x80 | uVar5 >> 0x19) + uVar2;
  uVar7 = ((uVar2 ^ uVar3) & uVar5 ^ uVar3) + uVar4 + local_a8[1] + 0xe8c7b756;
  uVar7 = (uVar7 * 0x1000 | uVar7 >> 0x14) + uVar5;
  uVar8 = ((uVar5 ^ uVar2) & uVar7 ^ uVar2) + local_a8[2] + uVar3 + 0x242070db;
  uVar8 = (uVar8 * 0x20000 | uVar8 >> 0xf) + uVar7;
  uVar9 = ((uVar7 ^ uVar5) & uVar8 ^ uVar5) + uVar2 + local_a8[3] + 0xc1bdceee;
  uVar9 = (uVar9 * 0x400000 | uVar9 >> 10) + uVar8;
  uVar5 = uVar5 + local_a8[4] + ((uVar8 ^ uVar7) & uVar9 ^ uVar7) + 0xf57c0faf;
  uVar5 = (uVar5 * 0x80 | uVar5 >> 0x19) + uVar9;
  uVar7 = uVar7 + local_a8[5] + ((uVar9 ^ uVar8) & uVar5 ^ uVar8) + 0x4787c62a;
  uVar7 = (uVar7 * 0x1000 | uVar7 >> 0x14) + uVar5;
  uVar8 = uVar8 + local_a8[6] + ((uVar5 ^ uVar9) & uVar7 ^ uVar9) + 0xa8304613;
  uVar8 = (uVar8 * 0x20000 | uVar8 >> 0xf) + uVar7;
  uVar9 = uVar9 + local_a8[7] + ((uVar7 ^ uVar5) & uVar8 ^ uVar5) + 0xfd469501;
  uVar10 = (uVar9 * 0x400000 | uVar9 >> 10) + uVar8;
  uVar5 = ((uVar8 ^ uVar7) & uVar10 ^ uVar7) + uVar5 + local_a8[8] + 0x698098d8;
  uVar9 = (uVar5 * 0x80 | uVar5 >> 0x19) + uVar10;
  uVar5 = uVar7 + local_a8[9] + ((uVar10 ^ uVar8) & uVar9 ^ uVar8) + 0x8b44f7af;
  uVar7 = (uVar5 * 0x1000 | uVar5 >> 0x14) + uVar9;
  uVar5 = (((uVar9 ^ uVar10) & uVar7 ^ uVar10) + uVar8 + local_a8[10]) - 0xa44f;
  uVar11 = (uVar5 * 0x20000 | uVar5 >> 0xf) + uVar7;
  uVar5 = ((uVar7 ^ uVar9) & uVar11 ^ uVar9) + uVar10 + local_a8[0xb] + 0x895cd7be;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar11;
  uVar8 = ((uVar11 ^ uVar7) & uVar5 ^ uVar7) + uVar9 + local_a8[0xc] + 0x6b901122;
  uVar10 = (uVar8 * 0x80 | uVar8 >> 0x19) + uVar5;
  uVar7 = ((uVar5 ^ uVar11) & uVar10 ^ uVar11) + uVar7 + local_a8[0xd] + 0xfd987193;
  uVar8 = (uVar7 * 0x1000 | uVar7 >> 0x14) + uVar10;
  uVar7 = uVar11 + local_a8[0xe] + (uVar5 & ~uVar8 | uVar8 & uVar10) + 0xa679438e;
  uVar9 = (uVar7 * 0x20000 | uVar7 >> 0xf) + uVar8;
  uVar5 = uVar5 + local_a8[0xf] + (uVar10 & ~uVar9 | uVar9 & uVar8) + 0x49b40821;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar9;
  uVar7 = uVar10 + local_a8[1] + (~uVar8 & uVar9 | uVar5 & uVar8) + 0xf61e2562;
  uVar7 = (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar5;
  uVar8 = uVar8 + local_a8[6] + (~uVar9 & uVar5 | uVar7 & uVar9) + 0xc040b340;
  uVar8 = (uVar8 * 0x200 | uVar8 >> 0x17) + uVar7;
  uVar9 = uVar9 + local_a8[0xb] + ((uVar8 ^ uVar7) & uVar5 ^ uVar7) + 0x265e5a51;
  uVar9 = (uVar9 * 0x4000 | uVar9 >> 0x12) + uVar8;
  uVar5 = uVar5 + local_a8[0] + ((uVar9 ^ uVar8) & uVar7 ^ uVar8) + 0xe9b6c7aa;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar9;
  uVar7 = uVar7 + local_a8[5] + ((uVar5 ^ uVar9) & uVar8 ^ uVar9) + 0xd62f105d;
  uVar7 = (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar5;
  uVar8 = uVar8 + local_a8[10] + ((uVar7 ^ uVar5) & uVar9 ^ uVar5) + 0x2441453;
  uVar8 = (uVar8 * 0x200 | uVar8 >> 0x17) + uVar7;
  uVar9 = uVar9 + local_a8[0xf] + ((uVar8 ^ uVar7) & uVar5 ^ uVar7) + 0xd8a1e681;
  uVar10 = (uVar9 * 0x4000 | uVar9 >> 0x12) + uVar8;
  uVar5 = uVar5 + local_a8[4] + ((uVar10 ^ uVar8) & uVar7 ^ uVar8) + 0xe7d3fbc8;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar10;
  uVar7 = uVar7 + local_a8[9] + ((uVar5 ^ uVar10) & uVar8 ^ uVar10) + 0x21e1cde6;
  uVar7 = (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar5;
  uVar8 = uVar8 + local_a8[0xe] + ((uVar7 ^ uVar5) & uVar10 ^ uVar5) + 0xc33707d6;
  uVar9 = (uVar8 * 0x200 | uVar8 >> 0x17) + uVar7;
  uVar8 = uVar10 + local_a8[3] + ((uVar9 ^ uVar7) & uVar5 ^ uVar7) + 0xf4d50d87;
  uVar10 = (uVar8 * 0x4000 | uVar8 >> 0x12) + uVar9;
  uVar5 = uVar5 + local_a8[8] + ((uVar10 ^ uVar9) & uVar7 ^ uVar9) + 0x455a14ed;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar10;
  uVar7 = uVar7 + local_a8[0xd] + ((uVar5 ^ uVar10) & uVar9 ^ uVar10) + 0xa9e3e905;
  uVar8 = (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar5;
  uVar7 = uVar9 + local_a8[2] + ((uVar8 ^ uVar5) & uVar10 ^ uVar5) + 0xfcefa3f8;
  uVar9 = (uVar7 * 0x200 | uVar7 >> 0x17) + uVar8;
  uVar7 = uVar10 + local_a8[7] + ((uVar9 ^ uVar8) & uVar5 ^ uVar8) + 0x676f02d9;
  uVar10 = (uVar7 * 0x4000 | uVar7 >> 0x12) + uVar9;
  uVar5 = ((uVar10 ^ uVar9) & uVar8 ^ uVar9) + uVar5 + local_a8[0xc] + 0x8d2a4c8a;
  uVar7 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar10;
  uVar5 = ((uVar7 ^ uVar10 ^ uVar9) + uVar8 + local_a8[5]) - 0x5c6be;
  uVar11 = (uVar5 * 0x10 | uVar5 >> 0x1c) + uVar7;
  uVar5 = (uVar7 ^ uVar10 ^ uVar11) + uVar9 + local_a8[8] + 0x8771f681;
  uVar5 = (uVar5 * 0x800 | uVar5 >> 0x15) + uVar11;
  uVar8 = (uVar11 ^ uVar7 ^ uVar5) + uVar10 + local_a8[0xb] + 0x6d9d6122;
  uVar8 = (uVar8 * 0x10000 | uVar8 >> 0x10) + uVar5;
  uVar7 = (uVar5 ^ uVar11 ^ uVar8) + uVar7 + local_a8[0xe] + 0xfde5380c;
  uVar9 = (uVar7 * 0x800000 | uVar7 >> 9) + uVar8;
  uVar7 = (uVar8 ^ uVar5 ^ uVar9) + uVar11 + local_a8[1] + 0xa4beea44;
  uVar10 = (uVar7 * 0x10 | uVar7 >> 0x1c) + uVar9;
  uVar5 = uVar5 + local_a8[4] + (uVar9 ^ uVar8 ^ uVar10) + 0x4bdecfa9;
  uVar5 = (uVar5 * 0x800 | uVar5 >> 0x15) + uVar10;
  uVar7 = uVar8 + local_a8[7] + (uVar10 ^ uVar9 ^ uVar5) + 0xf6bb4b60;
  uVar7 = (uVar7 * 0x10000 | uVar7 >> 0x10) + uVar5;
  uVar8 = uVar9 + local_a8[10] + (uVar5 ^ uVar10 ^ uVar7) + 0xbebfbc70;
  uVar9 = (uVar8 * 0x800000 | uVar8 >> 9) + uVar7;
  uVar8 = uVar10 + local_a8[0xd] + (uVar7 ^ uVar5 ^ uVar9) + 0x289b7ec6;
  uVar10 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar9;
  uVar5 = uVar5 + local_a8[0] + (uVar9 ^ uVar7 ^ uVar10) + 0xeaa127fa;
  uVar5 = (uVar5 * 0x800 | uVar5 >> 0x15) + uVar10;
  uVar7 = uVar7 + local_a8[3] + (uVar10 ^ uVar9 ^ uVar5) + 0xd4ef3085;
  uVar8 = (uVar7 * 0x10000 | uVar7 >> 0x10) + uVar5;
  uVar7 = (uVar5 ^ uVar10 ^ uVar8) + uVar9 + local_a8[6] + 0x4881d05;
  uVar7 = (uVar7 * 0x800000 | uVar7 >> 9) + uVar8;
  uVar9 = uVar10 + local_a8[9] + (uVar8 ^ uVar5 ^ uVar7) + 0xd9d4d039;
  uVar10 = (uVar9 * 0x10 | uVar9 >> 0x1c) + uVar7;
  uVar5 = (uVar7 ^ uVar8 ^ uVar10) + uVar5 + local_a8[0xc] + 0xe6db99e5;
  uVar9 = (uVar5 * 0x800 | uVar5 >> 0x15) + uVar10;
  uVar5 = uVar8 + local_a8[0xf] + (uVar10 ^ uVar7 ^ uVar9) + 0x1fa27cf8;
  uVar8 = (uVar5 * 0x10000 | uVar5 >> 0x10) + uVar9;
  uVar5 = (uVar9 ^ uVar10 ^ uVar8) + uVar7 + local_a8[2] + 0xc4ac5665;
  uVar5 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar8;
  uVar7 = ((~uVar9 | uVar5) ^ uVar8) + uVar10 + local_a8[0] + 0xf4292244;
  uVar10 = (uVar7 * 0x40 | uVar7 >> 0x1a) + uVar5;
  uVar7 = ((~uVar8 | uVar10) ^ uVar5) + uVar9 + local_a8[7] + 0x432aff97;
  uVar9 = (uVar7 * 0x400 | uVar7 >> 0x16) + uVar10;
  uVar7 = ((~uVar5 | uVar9) ^ uVar10) + uVar8 + local_a8[0xe] + 0xab9423a7;
  uVar7 = (uVar7 * 0x8000 | uVar7 >> 0x11) + uVar9;
  uVar5 = uVar5 + local_a8[5] + ((~uVar10 | uVar7) ^ uVar9) + 0xfc93a039;
  uVar5 = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar7;
  uVar8 = ((~uVar9 | uVar5) ^ uVar7) + uVar10 + local_a8[0xc] + 0x655b59c3;
  uVar8 = (uVar8 * 0x40 | uVar8 >> 0x1a) + uVar5;
  uVar9 = uVar9 + local_a8[3] + ((~uVar7 | uVar8) ^ uVar5) + 0x8f0ccc92;
  uVar10 = (uVar9 * 0x400 | uVar9 >> 0x16) + uVar8;
  uVar7 = (uVar7 + local_a8[10] + ((~uVar5 | uVar10) ^ uVar8)) - 0x100b83;
  uVar7 = (uVar7 * 0x8000 | uVar7 >> 0x11) + uVar10;
  uVar5 = uVar5 + local_a8[1] + ((~uVar8 | uVar7) ^ uVar10) + 0x85845dd1;
  uVar5 = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar7;
  uVar8 = uVar8 + local_a8[8] + ((~uVar10 | uVar5) ^ uVar7) + 0x6fa87e4f;
  uVar9 = (uVar8 * 0x40 | uVar8 >> 0x1a) + uVar5;
  uVar8 = ((~uVar7 | uVar9) ^ uVar5) + uVar10 + local_a8[0xf] + 0xfe2ce6e0;
  uVar8 = (uVar8 * 0x400 | uVar8 >> 0x16) + uVar9;
  uVar7 = uVar7 + local_a8[6] + ((~uVar5 | uVar8) ^ uVar9) + 0xa3014314;
  uVar7 = (uVar7 * 0x8000 | uVar7 >> 0x11) + uVar8;
  uVar5 = uVar5 + local_a8[0xd] + ((~uVar9 | uVar7) ^ uVar8) + 0x4e0811a1;
  uVar5 = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar7;
  uVar9 = uVar9 + local_a8[4] + ((~uVar8 | uVar5) ^ uVar7) + 0xf7537e82;
  uVar9 = (uVar9 * 0x40 | uVar9 >> 0x1a) + uVar5;
  uVar8 = uVar8 + local_a8[0xb] + ((~uVar7 | uVar9) ^ uVar5) + 0xbd3af235;
  uVar8 = (uVar8 * 0x400 | uVar8 >> 0x16) + uVar9;
  uVar7 = uVar7 + local_a8[2] + ((~uVar5 | uVar8) ^ uVar9) + 0x2ad7d2bb;
  uVar7 = (uVar7 * 0x8000 | uVar7 >> 0x11) + uVar8;
  uVar5 = uVar5 + local_a8[9] + ((~uVar9 | uVar7) ^ uVar8) + 0xeb86d391;
  *state = uVar9 + UVar1;
  state[1] = uVar2 + uVar7 + (uVar5 * 0x200000 | uVar5 >> 0xb);
  state[2] = uVar7 + uVar3;
  state[3] = uVar8 + uVar4;
  return;
}

Assistant:

static void MD5Transform(UINT4 state[4],
                         const unsigned char block[64])
{
  UINT4 a = state[0], b = state[1], c = state[2], d = state[3], x[16];

  Decode (x, block, 64);

  /* Round 1 */
  FF (a, b, c, d, x[ 0], S11, 0xd76aa478); /* 1 */
  FF (d, a, b, c, x[ 1], S12, 0xe8c7b756); /* 2 */
  FF (c, d, a, b, x[ 2], S13, 0x242070db); /* 3 */
  FF (b, c, d, a, x[ 3], S14, 0xc1bdceee); /* 4 */
  FF (a, b, c, d, x[ 4], S11, 0xf57c0faf); /* 5 */
  FF (d, a, b, c, x[ 5], S12, 0x4787c62a); /* 6 */
  FF (c, d, a, b, x[ 6], S13, 0xa8304613); /* 7 */
  FF (b, c, d, a, x[ 7], S14, 0xfd469501); /* 8 */
  FF (a, b, c, d, x[ 8], S11, 0x698098d8); /* 9 */
  FF (d, a, b, c, x[ 9], S12, 0x8b44f7af); /* 10 */
  FF (c, d, a, b, x[10], S13, 0xffff5bb1); /* 11 */
  FF (b, c, d, a, x[11], S14, 0x895cd7be); /* 12 */
  FF (a, b, c, d, x[12], S11, 0x6b901122); /* 13 */
  FF (d, a, b, c, x[13], S12, 0xfd987193); /* 14 */
  FF (c, d, a, b, x[14], S13, 0xa679438e); /* 15 */
  FF (b, c, d, a, x[15], S14, 0x49b40821); /* 16 */

 /* Round 2 */
  GG (a, b, c, d, x[ 1], S21, 0xf61e2562); /* 17 */
  GG (d, a, b, c, x[ 6], S22, 0xc040b340); /* 18 */
  GG (c, d, a, b, x[11], S23, 0x265e5a51); /* 19 */
  GG (b, c, d, a, x[ 0], S24, 0xe9b6c7aa); /* 20 */
  GG (a, b, c, d, x[ 5], S21, 0xd62f105d); /* 21 */
  GG (d, a, b, c, x[10], S22,  0x2441453); /* 22 */
  GG (c, d, a, b, x[15], S23, 0xd8a1e681); /* 23 */
  GG (b, c, d, a, x[ 4], S24, 0xe7d3fbc8); /* 24 */
  GG (a, b, c, d, x[ 9], S21, 0x21e1cde6); /* 25 */
  GG (d, a, b, c, x[14], S22, 0xc33707d6); /* 26 */
  GG (c, d, a, b, x[ 3], S23, 0xf4d50d87); /* 27 */
  GG (b, c, d, a, x[ 8], S24, 0x455a14ed); /* 28 */
  GG (a, b, c, d, x[13], S21, 0xa9e3e905); /* 29 */
  GG (d, a, b, c, x[ 2], S22, 0xfcefa3f8); /* 30 */
  GG (c, d, a, b, x[ 7], S23, 0x676f02d9); /* 31 */
  GG (b, c, d, a, x[12], S24, 0x8d2a4c8a); /* 32 */

  /* Round 3 */
  HH (a, b, c, d, x[ 5], S31, 0xfffa3942); /* 33 */
  HH (d, a, b, c, x[ 8], S32, 0x8771f681); /* 34 */
  HH (c, d, a, b, x[11], S33, 0x6d9d6122); /* 35 */
  HH (b, c, d, a, x[14], S34, 0xfde5380c); /* 36 */
  HH (a, b, c, d, x[ 1], S31, 0xa4beea44); /* 37 */
  HH (d, a, b, c, x[ 4], S32, 0x4bdecfa9); /* 38 */
  HH (c, d, a, b, x[ 7], S33, 0xf6bb4b60); /* 39 */
  HH (b, c, d, a, x[10], S34, 0xbebfbc70); /* 40 */
  HH (a, b, c, d, x[13], S31, 0x289b7ec6); /* 41 */
  HH (d, a, b, c, x[ 0], S32, 0xeaa127fa); /* 42 */
  HH (c, d, a, b, x[ 3], S33, 0xd4ef3085); /* 43 */
  HH (b, c, d, a, x[ 6], S34,  0x4881d05); /* 44 */
  HH (a, b, c, d, x[ 9], S31, 0xd9d4d039); /* 45 */
  HH (d, a, b, c, x[12], S32, 0xe6db99e5); /* 46 */
  HH (c, d, a, b, x[15], S33, 0x1fa27cf8); /* 47 */
  HH (b, c, d, a, x[ 2], S34, 0xc4ac5665); /* 48 */

  /* Round 4 */
  II (a, b, c, d, x[ 0], S41, 0xf4292244); /* 49 */
  II (d, a, b, c, x[ 7], S42, 0x432aff97); /* 50 */
  II (c, d, a, b, x[14], S43, 0xab9423a7); /* 51 */
  II (b, c, d, a, x[ 5], S44, 0xfc93a039); /* 52 */
  II (a, b, c, d, x[12], S41, 0x655b59c3); /* 53 */
  II (d, a, b, c, x[ 3], S42, 0x8f0ccc92); /* 54 */
  II (c, d, a, b, x[10], S43, 0xffeff47d); /* 55 */
  II (b, c, d, a, x[ 1], S44, 0x85845dd1); /* 56 */
  II (a, b, c, d, x[ 8], S41, 0x6fa87e4f); /* 57 */
  II (d, a, b, c, x[15], S42, 0xfe2ce6e0); /* 58 */
  II (c, d, a, b, x[ 6], S43, 0xa3014314); /* 59 */
  II (b, c, d, a, x[13], S44, 0x4e0811a1); /* 60 */
  II (a, b, c, d, x[ 4], S41, 0xf7537e82); /* 61 */
  II (d, a, b, c, x[11], S42, 0xbd3af235); /* 62 */
  II (c, d, a, b, x[ 2], S43, 0x2ad7d2bb); /* 63 */
  II (b, c, d, a, x[ 9], S44, 0xeb86d391); /* 64 */

  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;

  /* Zeroize sensitive information. */
  memset((void *)x, 0, sizeof (x));
}